

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_> *
__thiscall
llvm::DWARFUnit::findRnglistFromOffset
          (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
           *__return_storage_ptr__,DWARFUnit *this,uint64_t Offset)

{
  uint8_t uVar1;
  DWARFSection *pDVar2;
  Optional<llvm::object::SectionedAddress> BaseAddr;
  Optional<llvm::object::SectionedAddress> BaseAddr_00;
  DWARFDataExtractor Data;
  DWARFDebugRnglistTable *pDVar3;
  DWARFListTableBase<llvm::DWARFDebugRnglist> *this_00;
  char *Msg;
  storage_type *this_01;
  error_code EC;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::object::SectionedAddress,_true>_2 local_108;
  undefined8 local_f8;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::object::SectionedAddress,_true>_2 local_f0;
  undefined8 local_e0;
  char *local_d8;
  size_t sStack_d0;
  char *local_c8;
  size_t sStack_c0;
  undefined1 local_b8;
  uint8_t uStack_b7;
  undefined6 uStack_b6;
  pointer pRStack_b0;
  DWARFSection *local_a8;
  undefined1 local_a0 [8];
  DWARFDebugRangeList RangeList;
  Error local_70;
  Error local_68;
  Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>> *local_60;
  undefined1 local_58 [8];
  undefined8 local_50;
  undefined1 local_31;
  
  if ((this->Header).FormParams.Version < 5) {
    DWARFDebugRangeList::DWARFDebugRangeList((DWARFDebugRangeList *)local_a0);
    extractRangeList((DWARFUnit *)&stack0xffffffffffffffb0,(uint64_t)this,
                     (DWARFDebugRangeList *)Offset);
    if ((ulong)local_50 < (pointer)0x2) {
      getBaseAddress((Optional<llvm::object::SectionedAddress> *)&local_108.value,this);
      BaseAddr.Storage.field_0.value.SectionIndex = local_108.value.SectionIndex;
      BaseAddr.Storage.field_0.value.Address = local_108.value.Address;
      BaseAddr.Storage._16_8_ = local_f8;
      DWARFDebugRangeList::getAbsoluteRanges
                ((DWARFAddressRangesVector *)&stack0xffffffffffffffb0,
                 (DWARFDebugRangeList *)local_a0,BaseAddr);
      Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>::
      Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                ((Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                  *)__return_storage_ptr__,
                 (vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)
                 &stack0xffffffffffffffb0,(type *)0x0);
      std::_Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::
      ~_Vector_base((_Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                     *)&stack0xffffffffffffffb0);
    }
    else {
      local_70.Payload = (ErrorInfoBase *)(local_50 | 1);
      local_50 = (pointer)0x0;
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      Expected(__return_storage_ptr__,&local_70);
      if ((long *)((ulong)local_70.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_70.Payload & 0xfffffffffffffffe) + 8))();
      }
      if ((long *)(local_50 & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(local_50 & 0xfffffffffffffffe) + 8))();
      }
    }
    std::
    _Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
    ::~_Vector_base((_Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
                     *)&RangeList.AddressSize);
  }
  else if ((this->RngListTable).Storage.hasVal == true) {
    pDVar2 = this->RangeSection;
    RangeList.Entries.
    super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->Context->DObj)._M_t.
                  super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                  .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
    local_31 = this->isLittleEndian;
    local_60 = (Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                *)__return_storage_ptr__;
    pDVar3 = optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::getValue
                       (&(this->RngListTable).Storage);
    uVar1 = (pDVar3->super_DWARFListTableBase<llvm::DWARFDebugRnglist>).Header.HeaderData.AddrSize;
    local_d8 = (pDVar2->Data).Data;
    sStack_d0 = (pDVar2->Data).Length;
    this_00 = &optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::getValue
                         (&(this->RngListTable).Storage)->
               super_DWARFListTableBase<llvm::DWARFDebugRnglist>;
    local_c8 = local_d8;
    sStack_c0 = sStack_d0;
    local_b8 = local_31;
    pRStack_b0 = RangeList.Entries.
                 super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    Data.super_DataExtractor.AddressSize = uVar1;
    Data.super_DataExtractor.IsLittleEndian = local_31;
    Data.super_DataExtractor._18_6_ = uStack_b6;
    Data.super_DataExtractor.Data.Length = sStack_d0;
    Data.super_DataExtractor.Data.Data = local_d8;
    Data.Obj = (DWARFObject *)
               RangeList.Entries.
               super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    Data.Section = pDVar2;
    uStack_b7 = uVar1;
    local_a8 = pDVar2;
    DWARFListTableBase<llvm::DWARFDebugRnglist>::findList
              ((Expected<llvm::DWARFDebugRnglist> *)local_a0,this_00,Data,Offset);
    if (((byte)RangeList.Entries.
               super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
               ._M_impl.super__Vector_impl_data._M_start & 1) == 0) {
      this_01 = Expected<llvm::DWARFDebugRnglist>::getStorage
                          ((Expected<llvm::DWARFDebugRnglist> *)local_a0);
      getBaseAddress((Optional<llvm::object::SectionedAddress> *)&local_f0.value,this);
      __return_storage_ptr__ =
           (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
            *)local_60;
      BaseAddr_00.Storage.field_0.value.SectionIndex = local_f0.value.SectionIndex;
      BaseAddr_00.Storage.field_0.value.Address = local_f0.value.Address;
      BaseAddr_00.Storage._16_8_ = local_e0;
      DWARFDebugRnglist::getAbsoluteRanges
                ((DWARFAddressRangesVector *)&stack0xffffffffffffffb0,this_01,BaseAddr_00,this);
      Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>::
      Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                ((Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
                  *)__return_storage_ptr__,
                 (vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)
                 &stack0xffffffffffffffb0,(type *)0x0);
      std::_Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::
      ~_Vector_base((_Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                     *)&stack0xffffffffffffffb0);
    }
    else {
      Expected<llvm::DWARFDebugRnglist>::takeError((Expected<llvm::DWARFDebugRnglist> *)local_58);
      __return_storage_ptr__ =
           (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
            *)local_60;
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                *)local_60,(Error *)local_58);
      if ((long *)((ulong)local_58 & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_58 & 0xfffffffffffffffe) + 8))();
      }
    }
    Expected<llvm::DWARFDebugRnglist>::~Expected((Expected<llvm::DWARFDebugRnglist> *)local_a0);
  }
  else {
    Msg = (char *)std::_V2::generic_category();
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = &local_68;
    createStringError(EC,Msg);
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    Expected(__return_storage_ptr__,&local_68);
    if ((long *)((ulong)local_68.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_68.Payload & 0xfffffffffffffffe) + 8))();
    }
  }
  return (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
          *)(Expected<std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>>
             *)__return_storage_ptr__;
}

Assistant:

Expected<DWARFAddressRangesVector>
DWARFUnit::findRnglistFromOffset(uint64_t Offset) {
  if (getVersion() <= 4) {
    DWARFDebugRangeList RangeList;
    if (Error E = extractRangeList(Offset, RangeList))
      return std::move(E);
    return RangeList.getAbsoluteRanges(getBaseAddress());
  }
  if (RngListTable) {
    DWARFDataExtractor RangesData(Context.getDWARFObj(), *RangeSection,
                                  isLittleEndian, RngListTable->getAddrSize());
    auto RangeListOrError = RngListTable->findList(RangesData, Offset);
    if (RangeListOrError)
      return RangeListOrError.get().getAbsoluteRanges(getBaseAddress(), *this);
    return RangeListOrError.takeError();
  }

  return createStringError(errc::invalid_argument,
                           "missing or invalid range list table");
}